

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O2

int stless_(double *y,int *n,int *len,int *ideg,int *njump,int *userw,double *rw,double *ys,
           double *res)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int local_74;
  double local_68;
  double d__1;
  uint *local_58;
  int local_4c;
  double *local_48;
  int local_3c;
  int local_38;
  int ok;
  int nleft;
  int nright;
  
  if (*n < 2) {
    *ys = *y;
  }
  else {
    local_58 = (uint *)n;
    local_48 = y;
    local_4c = imin(*njump,*n + -1);
    uVar3 = *len;
    uVar4 = *local_58;
    lVar8 = (long)(int)uVar4;
    d__1 = (double)(long)local_4c;
    if ((int)uVar3 < (int)uVar4) {
      iVar14 = (int)(uVar3 + 1) / 2;
      if (local_4c == 1) {
        local_38 = 1;
        uVar13 = 0;
        uVar11 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar11 = uVar13;
        }
        local_74 = 1;
        lVar8 = 1;
        ok = uVar3;
        for (; uVar11 << 3 != uVar13; uVar13 = uVar13 + 8) {
          if ((iVar14 < lVar8) && (uVar3 != *local_58)) {
            local_74 = local_74 + 1;
            ok = uVar3 + 1;
            local_38 = local_74;
            uVar3 = ok;
          }
          local_68 = (double)(int)lVar8;
          stlest_(local_48,(int *)local_58,len,ideg,&local_68,(double *)((long)ys + uVar13),
                  &local_38,&ok,res,userw,rw,&local_3c);
          if (local_3c == 0) {
            *(double *)((long)ys + uVar13) = *(double *)((long)local_48 + uVar13);
          }
          lVar8 = lVar8 + 1;
        }
      }
      else {
        lVar10 = 1;
        while( true ) {
          bVar5 = lVar10 <= lVar8;
          if (local_4c < 0) {
            bVar5 = lVar8 <= lVar10;
          }
          if (!bVar5) break;
          if (lVar10 < iVar14) {
            local_38 = 1;
            ok = *len;
          }
          else {
            ok = *local_58;
            if (ok - iVar14 < lVar10) {
              local_38 = (ok - *len) + 1;
            }
            else {
              iVar7 = (int)lVar10 - iVar14;
              local_38 = iVar7 + 1;
              ok = iVar7 + *len;
            }
          }
          local_68 = (double)(int)lVar10;
          stlest_(local_48,(int *)local_58,len,ideg,&local_68,ys + lVar10 + -1,&local_38,&ok,res,
                  userw,rw,&local_3c);
          if (local_3c == 0) {
            ys[lVar10 + -1] = local_48[lVar10 + -1];
          }
          lVar10 = lVar10 + (long)d__1;
        }
      }
    }
    else {
      lVar10 = 1;
      local_38 = 1;
      ok = uVar4;
      while( true ) {
        bVar5 = lVar10 <= lVar8;
        if (local_4c < 0) {
          bVar5 = lVar8 <= lVar10;
        }
        if (!bVar5) break;
        local_68 = (double)(int)lVar10;
        stlest_(local_48,(int *)local_58,len,ideg,&local_68,ys + lVar10 + -1,&local_38,&ok,res,userw
                ,rw,&local_3c);
        if (local_3c == 0) {
          ys[lVar10 + -1] = local_48[lVar10 + -1];
        }
        lVar10 = lVar10 + (long)d__1;
      }
    }
    pdVar6 = local_48;
    if (local_4c != 1) {
      iVar14 = 1;
      uVar3 = *local_58;
      lVar10 = 0;
      pdVar9 = ys;
      lVar8 = 1;
      while( true ) {
        bVar5 = lVar8 <= (int)(uVar3 - local_4c);
        if (local_4c < 0) {
          bVar5 = (int)(uVar3 - local_4c) <= lVar8;
        }
        if (!bVar5) break;
        dVar1 = ys[lVar8 + (long)d__1 + -1];
        dVar2 = ys[lVar8 + -1];
        for (lVar12 = 1; lVar10 + lVar12 < (long)d__1 + lVar8 + -1; lVar12 = lVar12 + 1) {
          pdVar9[lVar12] =
               (double)(int)lVar12 * ((dVar1 - dVar2) / (double)local_4c) + ys[lVar8 + -1];
        }
        pdVar9 = pdVar9 + (long)d__1;
        lVar10 = lVar10 + (long)d__1;
        lVar8 = lVar8 + (long)d__1;
      }
      uVar4 = uVar3 - (int)(uVar3 - 1) % d__1._0_4_;
      if (uVar4 != uVar3) {
        local_68 = (double)(int)uVar3;
        stlest_(local_48,(int *)local_58,len,ideg,&local_68,ys + (long)(int)uVar3 + -1,&local_38,&ok
                ,res,userw,rw,&local_3c);
        uVar3 = *local_58;
        lVar8 = (long)(int)uVar3;
        if (local_3c == 0) {
          ys[lVar8 + -1] = pdVar6[lVar8 + -1];
        }
        if (uVar4 - 1 != uVar3 - 2) {
          dVar1 = ys[lVar8 + -1];
          dVar2 = ys[(long)(int)uVar4 + -1];
          for (lVar10 = (long)(int)(uVar4 + 1); lVar10 < lVar8; lVar10 = lVar10 + 1) {
            ys[lVar10 + -1] =
                 (double)iVar14 * ((dVar1 - dVar2) / (double)(int)(uVar3 - uVar4)) +
                 ys[(long)(int)uVar4 + -1];
            iVar14 = iVar14 + 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int stless_(double *y, int *n, int *len, int *ideg, int *njump, int *userw, double *rw, double *ys,
	 double *res)
{
    /* System generated locals */
    int i__1, i__2, i__3;
    double d__1;

    /* Local variables */
    int i__, j, k;
    int ok;
    int nsh;
    double delta;
    int nleft, newnj, nright;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --res;
    --ys;
    --rw;
    --y;

    /* Function Body */
    if (*n < 2) {
	ys[1] = y[1];
	return 0;
    }
/* Computing MIN */
    i__1 = *njump, i__2 = *n - 1;
    newnj = imin(i__1,i__2);
    if (*len >= *n) {
	nleft = 1;
	nright = *n;
	i__1 = *n;
	i__2 = newnj;
	for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	    d__1 = (double) i__;
	    stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright, &
		    res[1], userw, &rw[1], &ok);
	    if (! ok) {
		ys[i__] = y[i__];
	    }
/* L20: */
	}
    } else {
	if (newnj == 1) {
	    nsh = (*len + 1) / 2;
	    nleft = 1;
	    nright = *len;
	    i__2 = *n;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		if (i__ > nsh && nright != *n) {
		    ++nleft;
		    ++nright;
		}
		d__1 = (double) i__;
		stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright,
			 &res[1], userw, &rw[1], &ok);
		if (! ok) {
		    ys[i__] = y[i__];
		}
/* L30: */
	    }
	} else {
	    nsh = (*len + 1) / 2;
	    i__2 = *n;
	    i__1 = newnj;
	    for (i__ = 1; i__1 < 0 ? i__ >= i__2 : i__ <= i__2; i__ += i__1) {
		if (i__ < nsh) {
		    nleft = 1;
		    nright = *len;
		} else if (i__ >= *n - nsh + 1) {
		    nleft = *n - *len + 1;
		    nright = *n;
		} else {
		    nleft = i__ - nsh + 1;
		    nright = *len + i__ - nsh;
		}
		d__1 = (double) i__;
		stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright,
			 &res[1], userw, &rw[1], &ok);
		if (! ok) {
		    ys[i__] = y[i__];
		}
/* L40: */
	    }
	}
    }
    if (newnj != 1) {
	i__1 = *n - newnj;
	i__2 = newnj;
	for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	    delta = (ys[i__ + newnj] - ys[i__]) / (double) newnj;
	    i__3 = i__ + newnj - 1;
	    for (j = i__ + 1; j <= i__3; ++j) {
		ys[j] = ys[i__] + delta * (double) (j - i__);
/* L47: */
	    }
/* L45: */
	}
	k = (*n - 1) / newnj * newnj + 1;
	if (k != *n) {
	    d__1 = (double) (*n);
	    stlest_(&y[1], n, len, ideg, &d__1, &ys[*n], &nleft, &nright, &
		    res[1], userw, &rw[1], &ok);
	    if (! ok) {
		ys[*n] = y[*n];
	    }
	    if (k != *n - 1) {
		delta = (ys[*n] - ys[k]) / (double) (*n - k);
		i__2 = *n - 1;
		for (j = k + 1; j <= i__2; ++j) {
		    ys[j] = ys[k] + delta * (double) (j - k);
/* L55: */
		}
	    }
	}
    }
	return 0;
}